

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassembler.cpp
# Opt level: O2

void __thiscall LLVMBC::StreamState::append(StreamState *this,SwitchInst *branch,bool param_2)

{
  const_iterator this_00;
  const_iterator cVar1;
  BasicBlock *local_40;
  Value *local_38;
  
  local_38 = SwitchInst::getCondition(branch);
  local_40 = SwitchInst::getDefaultDest(branch);
  append<char_const(&)[8],LLVMBC::Value*,char_const(&)[3],LLVMBC::BasicBlock*>
            (this,(char (*) [8])"switch ",&local_38,(char (*) [3])", ",&local_40);
  begin_scope(this);
  this_00 = SwitchInst::case_begin(branch);
  while( true ) {
    cVar1 = SwitchInst::case_end(branch);
    if (this_00._M_current == cVar1._M_current) break;
    newline(this);
    local_38 = (Value *)SwitchInst::Case::getCaseValue(this_00._M_current);
    local_40 = SwitchInst::Case::getCaseSuccessor(this_00._M_current);
    append<LLVMBC::ConstantInt*,char_const(&)[3],LLVMBC::BasicBlock*>
              (this,(ConstantInt **)&local_38,(char (*) [3])", ",&local_40);
    this_00._M_current = this_00._M_current + 1;
  }
  end_scope(this);
  return;
}

Assistant:

void StreamState::append(SwitchInst *branch, bool)
{
	append("switch ", branch->getCondition(), ", ", branch->getDefaultDest());
	begin_scope();
	for (auto itr = branch->case_begin(); itr != branch->case_end(); ++itr)
	{
		newline();
		append(itr->getCaseValue(), ", ", itr->getCaseSuccessor());
	}
	end_scope();
}